

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

bool __thiscall
CoreML::Specification::LoopLayerParams::MergePartialFromCodedStream
          (LoopLayerParams *this,CodedInputStream *input)

{
  ArenaStringPtr *this_00;
  byte bVar1;
  byte *pbVar2;
  uint8 *puVar3;
  bool bVar4;
  int length;
  uint32 uVar5;
  int byte_limit;
  NeuralNetwork *this_01;
  pair<int,_int> pVar6;
  char cVar7;
  ulong uVar8;
  string *value;
  pair<unsigned_long,_bool> pVar9;
  
  this_00 = &this->conditionvar_;
LAB_0021ee06:
  pbVar2 = input->buffer_;
  uVar5 = 0;
  if (pbVar2 < input->buffer_end_) {
    bVar1 = *pbVar2;
    uVar5 = (uint32)bVar1;
    if ((char)bVar1 < '\x01') goto LAB_0021ee29;
    input->buffer_ = pbVar2 + 1;
    uVar8 = (ulong)bVar1 | 0x100000000;
  }
  else {
LAB_0021ee29:
    uVar5 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar5);
    uVar8 = 0;
    if (uVar5 - 1 < 0x7f) {
      uVar8 = 0x100000000;
    }
    uVar8 = uVar5 | uVar8;
  }
  uVar5 = (uint32)uVar8;
  if ((uVar8 & 0x100000000) == 0) goto switchD_0021ee87_default;
  cVar7 = (char)uVar8;
  switch((uint)(uVar8 >> 3) & 0x1fffffff) {
  case 1:
    if (cVar7 == '\b') {
      puVar3 = input->buffer_;
      if ((puVar3 < input->buffer_end_) && (-1 < (long)(char)*puVar3)) {
        this->maxloopiterations_ = (long)(char)*puVar3;
        input->buffer_ = puVar3 + 1;
      }
      else {
        pVar9 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
        this->maxloopiterations_ = pVar9.first;
        if (((undefined1  [16])pVar9 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          return false;
        }
      }
      goto LAB_0021ee06;
    }
    break;
  case 2:
    if (cVar7 != '\x12') break;
    value = this_00->ptr_;
    if (value == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
      google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                (this_00,(string *)
                         &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
      value = this_00->ptr_;
    }
    bVar4 = google::protobuf::internal::WireFormatLite::ReadBytes(input,value);
    if (!bVar4) {
      return false;
    }
    bVar4 = google::protobuf::internal::WireFormatLite::VerifyUtf8String
                      ((this_00->ptr_->_M_dataplus)._M_p,(int)this_00->ptr_->_M_string_length,PARSE,
                       "CoreML.Specification.LoopLayerParams.conditionVar");
    if (!bVar4) {
      return false;
    }
    goto LAB_0021ee06;
  case 3:
    if (cVar7 != '\x1a') break;
    this_01 = this->conditionnetwork_;
    if (this_01 == (NeuralNetwork *)0x0) {
      this_01 = (NeuralNetwork *)operator_new(0x58);
      NeuralNetwork::NeuralNetwork(this_01);
      this->conditionnetwork_ = this_01;
    }
LAB_0021ef0e:
    puVar3 = input->buffer_;
    if ((puVar3 < input->buffer_end_) && (byte_limit = (int)(char)*puVar3, -1 < (char)*puVar3)) {
      input->buffer_ = puVar3 + 1;
    }
    else {
      byte_limit = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
      if (byte_limit < 0) {
        return false;
      }
    }
    pVar6 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                      (input,byte_limit);
    if ((long)pVar6 < 0) {
      return false;
    }
    bVar4 = NeuralNetwork::MergePartialFromCodedStream(this_01,input);
    if (!bVar4) {
      return false;
    }
    bVar4 = google::protobuf::io::CodedInputStream::DecrementRecursionDepthAndPopLimit
                      (input,pVar6.first);
    goto LAB_0021ee6b;
  case 4:
    if (cVar7 == '\"') {
      this_01 = this->bodynetwork_;
      if (this_01 == (NeuralNetwork *)0x0) {
        this_01 = (NeuralNetwork *)operator_new(0x58);
        NeuralNetwork::NeuralNetwork(this_01);
        this->bodynetwork_ = this_01;
      }
      goto LAB_0021ef0e;
    }
  }
switchD_0021ee87_default:
  if (uVar5 == 0) {
    return true;
  }
  if ((uVar5 & 7) == 4) {
    return true;
  }
  bVar4 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar5);
LAB_0021ee6b:
  if (bVar4 == false) {
    return false;
  }
  goto LAB_0021ee06;
}

Assistant:

bool LoopLayerParams::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.LoopLayerParams)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // uint64 maxLoopIterations = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 input, &maxloopiterations_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // string conditionVar = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(18u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_conditionvar()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->conditionvar().data(), this->conditionvar().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.LoopLayerParams.conditionVar"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.NeuralNetwork conditionNetwork = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(26u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_conditionnetwork()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.NeuralNetwork bodyNetwork = 4;
      case 4: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(34u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_bodynetwork()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.LoopLayerParams)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.LoopLayerParams)
  return false;
#undef DO_
}